

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cp.c
# Opt level: O3

void i2cp_offer(i2cp_state *state,uint8_t *data,ssize_t sz)

{
  uint uVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint8_t uVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint32_t uVar10;
  
  if (sz == 0) {
    i2cp_ringbuf_flush(&state->readbuf,i2cp_read_msg,state);
    return;
  }
  if (-1 < sz) {
    puVar2 = (state->readcur).buf;
    while (uVar9 = (ulong)(state->readcur).sz, sz + uVar9 < 0x10000) {
      memcpy(puVar2 + uVar9,data,sz);
      uVar10 = (int)sz + (state->readcur).sz;
      (state->readcur).sz = uVar10;
      if (uVar10 < 5) {
        return;
      }
      uVar7 = *(uint *)puVar2;
      uVar8 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
      uVar1 = uVar8 + 5;
      if (uVar10 < uVar1) {
        return;
      }
      uVar5 = (state->readbuf).sz;
      if (uVar5 < 0x20) {
        uVar4 = (state->readcur).buf[4];
        uVar6 = (state->readbuf).idx;
        (state->readbuf).sz = uVar5 + 1;
        (state->readbuf).idx = uVar6 + 1 & 0x1f;
        puVar3 = (state->readbuf).buffs[0].buf + (ulong)uVar6 * 0x10000 + (ulong)uVar6 * 4 + -4;
        *(uint *)puVar3 = uVar1;
        *(uint *)(puVar3 + 4) = uVar7;
        puVar3[8] = uVar4;
        memcpy(puVar3 + 9,(state->readcur).buf + 5,(ulong)uVar8);
        uVar10 = (state->readcur).sz;
      }
      (state->readcur).sz = 0;
      sz = (ssize_t)(uVar10 - uVar1);
      if (uVar10 - uVar1 == 0) {
        return;
      }
      data = puVar2 + sz;
    }
  }
  return;
}

Assistant:

void i2cp_offer(struct i2cp_state * state, uint8_t * data, ssize_t sz)
{
  if(sz == 0)
  {
    i2cp_flush_read(state);
    return;
  }
  if(sz < 0) return;
  
  if(sizeof(state->readcur.buf) <= state->readcur.sz + sz)
  {
    return;
  }
  memcpy(state->readcur.buf + state->readcur.sz, data, sz);
  state->readcur.sz += sz;
  

  if(state->readcur.sz > 4)
  {
    uint32_t curlen = bufbe32toh(state->readcur.buf);
    if( curlen + 5 <= state->readcur.sz)
    {
      i2cp_ringbuf_append(&state->readbuf, state->readcur.buf[4], state->readcur.buf + 5, curlen);
      ssize_t diff = state->readcur.sz - (curlen + 5);
      state->readcur.sz = 0;
      if(diff > 0)
        i2cp_offer(state, state->readcur.buf + diff, diff);
    }
  }
}